

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveOut::out<double,6ul>(ChArchiveOut *this,ChNameValue<double[6]> *bVal)

{
  long lVar1;
  size_t i;
  long lVar2;
  ChValueSpecific<double[6]> specVal;
  char buffer [20];
  char *local_98;
  long local_90;
  undefined1 local_88;
  ChValueSpecific<double[6]> local_80;
  char local_48 [24];
  
  ChValueSpecific<double[6]>::ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,&local_80,6);
  lVar1 = 0;
  lVar2 = 0;
  do {
    sprintf(local_48,"%lu",lVar2);
    local_90 = (long)*bVal->_value + lVar1;
    local_88 = 0;
    local_98 = local_48;
    (*(this->super_ChArchive)._vptr_ChArchive[4])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,&local_80,6);
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 8;
  } while (lVar2 != 6);
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80,6);
  local_80.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00b2abb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.super_ChValue._name._M_dataplus._M_p != &local_80.super_ChValue._name.field_2) {
    operator_delete(local_80.super_ChValue._name._M_dataplus._M_p,
                    local_80.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }